

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDataServerCommand.cpp
# Opt level: O2

void __thiscall
OpenDataServerCommand::OpenDataServerCommand
          (OpenDataServerCommand *this,DataCommands *dataCommands,DataBinds *dataBinds,
          DataVars *dataVars,pthread_mutex_t *mutex)

{
  undefined8 uVar1;
  undefined8 uVar2;
  __pthread_internal_list *p_Var3;
  
  (this->super_Command)._vptr_Command = (_func_int **)&PTR_doCommand_0012a6a0;
  (this->deathMap1).super__Vector_base<DataReaderServer_*,_std::allocator<DataReaderServer_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->deathMap1).super__Vector_base<DataReaderServer_*,_std::allocator<DataReaderServer_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->deathMap1).super__Vector_base<DataReaderServer_*,_std::allocator<DataReaderServer_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->deathMap2).
  super__Vector_base<OpenDataServerCommand::Params_*,_std::allocator<OpenDataServerCommand::Params_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->deathMap2).
  super__Vector_base<OpenDataServerCommand::Params_*,_std::allocator<OpenDataServerCommand::Params_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->deathMap2).
  super__Vector_base<OpenDataServerCommand::Params_*,_std::allocator<OpenDataServerCommand::Params_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->dataCommands = dataCommands;
  this->dataBinds = dataBinds;
  this->dataVars = dataVars;
  uVar1 = *(undefined8 *)&(mutex->__data).__owner;
  uVar2 = *(undefined8 *)&(mutex->__data).__kind;
  p_Var3 = (mutex->__data).__list.__prev;
  (this->mutex).__align = mutex->__align;
  *(undefined8 *)((long)&this->mutex + 8) = uVar1;
  *(undefined8 *)((long)&this->mutex + 0x10) = uVar2;
  (this->mutex).__data.__list.__prev = p_Var3;
  (this->mutex).__data.__list.__next = (mutex->__data).__list.__next;
  return;
}

Assistant:

OpenDataServerCommand::OpenDataServerCommand(DataCommands *dataCommands, DataBinds *dataBinds, DataVars *dataVars,
                                             pthread_mutex_t &mutex) {
    this->dataCommands = dataCommands;
    this->dataBinds = dataBinds;
    this->dataVars = dataVars;
    this->mutex = mutex;
}